

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void array_run_container_lazy_xor
               (array_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  uint16_t start;
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = 0;
  run_container_grow(dst,src_2->n_runs + src_1->cardinality,false);
  dst->n_runs = 0;
  iVar1 = src_2->n_runs;
  if (iVar1 < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    iVar4 = 0;
    if (0 < src_1->cardinality) {
      iVar4 = 0;
      iVar2 = 0;
      do {
        start = src_2->runs[iVar4].value;
        if (src_1->array[iVar2] < start) {
          run_container_smart_append_exclusive(dst,src_1->array[iVar2],0);
          iVar2 = iVar2 + 1;
        }
        else {
          run_container_smart_append_exclusive(dst,start,src_2->runs[iVar4].length);
          iVar4 = iVar4 + 1;
        }
        iVar1 = src_2->n_runs;
      } while ((iVar4 < iVar1) && (iVar2 < src_1->cardinality));
    }
  }
  if (iVar2 < src_1->cardinality) {
    lVar3 = (long)iVar2;
    do {
      run_container_smart_append_exclusive(dst,src_1->array[lVar3],0);
      lVar3 = lVar3 + 1;
    } while (lVar3 < src_1->cardinality);
    iVar1 = src_2->n_runs;
  }
  if (iVar4 < iVar1) {
    lVar3 = (long)iVar4;
    do {
      run_container_smart_append_exclusive(dst,src_2->runs[lVar3].value,src_2->runs[lVar3].length);
      lVar3 = lVar3 + 1;
    } while (lVar3 < src_2->n_runs);
  }
  return;
}

Assistant:

void array_run_container_lazy_xor(const array_container_t *src_1,
                                  const run_container_t *src_2,
                                  run_container_t *dst) {
    run_container_grow(dst, src_1->cardinality + src_2->n_runs, false);
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    dst->n_runs = 0;

    while ((rlepos < src_2->n_runs) && (arraypos < src_1->cardinality)) {
        if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
            run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                                 src_2->runs[rlepos].length);
            rlepos++;
        } else {
            run_container_smart_append_exclusive(dst, src_1->array[arraypos],
                                                 0);
            arraypos++;
        }
    }
    while (arraypos < src_1->cardinality) {
        run_container_smart_append_exclusive(dst, src_1->array[arraypos], 0);
        arraypos++;
    }
    while (rlepos < src_2->n_runs) {
        run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                             src_2->runs[rlepos].length);
        rlepos++;
    }
}